

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

CURLUcode ipv6_parse(Curl_URL *u,char *hostname,size_t hlen)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  char *__s;
  CURLUcode CVar7;
  char *pcVar8;
  char zoneid [16];
  
  CVar7 = CURLUE_BAD_IPV6;
  if (3 < hlen) {
    __s = hostname + 1;
    sVar3 = strspn(__s,"0123456789abcdefABCDEF:.");
    sVar5 = hlen - 2;
    if (hlen - 2 == sVar3) {
LAB_001622de:
      __s[sVar5] = '\0';
      iVar2 = inet_pton(10,__s,zoneid);
      if (iVar2 == 1) {
        pcVar4 = inet_ntop(10,zoneid,__s,(socklen_t)sVar5);
        if (pcVar4 != (char *)0x0) {
          sVar5 = strlen(__s);
          hostname[sVar5 + 2] = '\0';
        }
        __s[sVar5] = ']';
        CVar7 = CURLUE_OK;
      }
      else {
        CVar7 = CURLUE_BAD_IPV6;
      }
    }
    else if (__s[sVar3] == '%') {
      pcVar8 = __s + sVar3;
      pcVar4 = pcVar8 + 1;
      if ((((pcVar8[1] == '2') && (pcVar8[2] == '5')) && (pcVar8[3] != '\0')) && (pcVar8[3] != ']'))
      {
        pcVar4 = pcVar8 + 3;
      }
      CVar7 = CURLUE_BAD_IPV6;
      for (uVar6 = 0; cVar1 = pcVar4[uVar6], cVar1 != '\0'; uVar6 = uVar6 + 1) {
        if ((cVar1 == ']') || (0xe < uVar6)) {
          if (uVar6 == 0) {
            return CURLUE_BAD_IPV6;
          }
          if (cVar1 != ']') {
            return CURLUE_BAD_IPV6;
          }
          zoneid[uVar6] = '\0';
          pcVar4 = (*Curl_cstrdup)(zoneid);
          u->zoneid = pcVar4;
          if (pcVar4 == (char *)0x0) {
            return CURLUE_OUT_OF_MEMORY;
          }
          pcVar8[0] = ']';
          pcVar8[1] = '\0';
          sVar5 = sVar3;
          goto LAB_001622de;
        }
        zoneid[uVar6] = cVar1;
      }
    }
  }
  return CVar7;
}

Assistant:

static CURLUcode ipv6_parse(struct Curl_URL *u, char *hostname,
                            size_t hlen) /* length of hostname */
{
  size_t len;
  DEBUGASSERT(*hostname == '[');
  if(hlen < 4) /* '[::]' is the shortest possible valid string */
    return CURLUE_BAD_IPV6;
  hostname++;
  hlen -= 2;

  /* only valid IPv6 letters are ok */
  len = strspn(hostname, "0123456789abcdefABCDEF:.");

  if(hlen != len) {
    hlen = len;
    if(hostname[len] == '%') {
      /* this could now be '%[zone id]' */
      char zoneid[16];
      int i = 0;
      char *h = &hostname[len + 1];
      /* pass '25' if present and is a URL encoded percent sign */
      if(!strncmp(h, "25", 2) && h[2] && (h[2] != ']'))
        h += 2;
      while(*h && (*h != ']') && (i < 15))
        zoneid[i++] = *h++;
      if(!i || (']' != *h))
        return CURLUE_BAD_IPV6;
      zoneid[i] = 0;
      u->zoneid = strdup(zoneid);
      if(!u->zoneid)
        return CURLUE_OUT_OF_MEMORY;
      hostname[len] = ']'; /* insert end bracket */
      hostname[len + 1] = 0; /* terminate the hostname */
    }
    else
      return CURLUE_BAD_IPV6;
    /* hostname is fine */
  }

  /* Normalize the IPv6 address */
  {
    char dest[16]; /* fits a binary IPv6 address */
    hostname[hlen] = 0; /* end the address there */
    if(1 != curlx_inet_pton(AF_INET6, hostname, dest))
      return CURLUE_BAD_IPV6;
    if(curlx_inet_ntop(AF_INET6, dest, hostname, hlen)) {
      hlen = strlen(hostname); /* might be shorter now */
      hostname[hlen + 1] = 0;
    }
    hostname[hlen] = ']'; /* restore ending bracket */
  }
  return CURLUE_OK;
}